

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,long elements)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  Arena *pAVar4;
  Type *pTVar5;
  int local_148;
  int local_144;
  int i_1;
  int i;
  Arena *arena;
  LogMessage local_130;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  long local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements_local;
  int num_local;
  int start_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_61 = 0;
  local_28 = elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x578);
    local_61 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(local_75,pLVar3);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_b1 = 0;
  if ((int)elements_local < 0) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x579);
    local_b1 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_b0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_b2,pLVar3);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  iVar1 = elements_local._4_4_ + (int)elements_local;
  iVar2 = size(this);
  local_f1 = 0;
  if (iVar2 < iVar1) {
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x57a);
    local_f1 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_f0,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_f2,pLVar3);
  }
  if ((local_f1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_f0);
  }
  if ((int)elements_local != 0) {
    arena._7_1_ = 0;
    if (local_28 == 0) {
      internal::LogMessage::LogMessage
                (&local_130,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x57e);
      arena._7_1_ = 1;
      pLVar3 = internal::LogMessage::operator<<
                         (&local_130,"CHECK failed: (elements) != (nullptr): ");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
                         );
      internal::LogFinisher::operator=((LogFinisher *)((long)&arena + 6),pLVar3);
    }
    if ((arena._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_130);
    }
    if (local_28 == 0) {
      internal::RepeatedPtrFieldBase::CloseGap
                (&this->super_RepeatedPtrFieldBase,elements_local._4_4_,(int)elements_local);
    }
    else {
      pAVar4 = GetArena(this);
      if (pAVar4 == (Arena *)0x0) {
        for (local_148 = 0; local_148 < (int)elements_local; local_148 = local_148 + 1) {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,local_148 + elements_local._4_4_);
          *(Type **)(local_28 + (long)local_148 * 8) = pTVar5;
        }
      }
      else {
        for (local_144 = 0; local_144 < (int)elements_local; local_144 = local_144 + 1) {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,local_144 + elements_local._4_4_);
          pTVar5 = internal::RepeatedPtrFieldBase::
                   copy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (pTVar5);
          *(Type **)(local_28 + (long)local_144 * 8) = pTVar5;
        }
      }
      internal::RepeatedPtrFieldBase::CloseGap
                (&this->super_RepeatedPtrFieldBase,elements_local._4_4_,(int)elements_local);
    }
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num == 0) return;

  GOOGLE_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements == nullptr) {
    CloseGap(start, num);
    return;
  }

  Arena* arena = GetArena();
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  // Always copy.
  for (int i = 0; i < num; ++i) {
    elements[i] = copy<TypeHandler>(
        RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start));
  }
  if (arena == nullptr) {
    for (int i = 0; i < num; ++i) {
      delete RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
    }
  }
#else   // PROTOBUF_FORCE_COPY_IN_RELEASE
  // If we're on an arena, we perform a copy for each element so that the
  // returned elements are heap-allocated. Otherwise, just forward it.
  if (arena != nullptr) {
    for (int i = 0; i < num; ++i) {
      elements[i] = copy<TypeHandler>(
          RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start));
    }
  } else {
    for (int i = 0; i < num; ++i) {
      elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
    }
  }
#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE
  CloseGap(start, num);
}